

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int gettime(event_base *base,timeval *tp)

{
  __suseconds_t _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  timeval tv;
  timeval local_30;
  
  if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    iVar2 = evthread_is_debug_lock_held_(base->th_base_lock);
    if (iVar2 == 0) {
      gettime_cold_1();
    }
  }
  if ((base->tv_cache).tv_sec == 0) {
    iVar2 = evutil_gettime_monotonic_(&base->monotonic_timer,tp);
    if (iVar2 == -1) {
      iVar2 = -1;
    }
    else {
      iVar2 = 0;
      if (base->last_updated_clock_diff + 5 < tp->tv_sec) {
        iVar2 = 0;
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        lVar3 = local_30.tv_sec - tp->tv_sec;
        (base->tv_clock_diff).tv_sec = lVar3;
        lVar4 = local_30.tv_usec - tp->tv_usec;
        (base->tv_clock_diff).tv_usec = lVar4;
        if (lVar4 < 0) {
          (base->tv_clock_diff).tv_sec = lVar3 + -1;
          (base->tv_clock_diff).tv_usec = lVar4 + 1000000;
        }
        base->last_updated_clock_diff = tp->tv_sec;
      }
    }
  }
  else {
    _Var1 = (base->tv_cache).tv_usec;
    tp->tv_sec = (base->tv_cache).tv_sec;
    tp->tv_usec = _Var1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
gettime(struct event_base *base, struct timeval *tp)
{
	EVENT_BASE_ASSERT_LOCKED(base);

	if (base->tv_cache.tv_sec) {
		*tp = base->tv_cache;
		return (0);
	}

	if (evutil_gettime_monotonic_(&base->monotonic_timer, tp) == -1) {
		return -1;
	}

	if (base->last_updated_clock_diff + CLOCK_SYNC_INTERVAL
	    < tp->tv_sec) {
		struct timeval tv;
		evutil_gettimeofday(&tv,NULL);
		evutil_timersub(&tv, tp, &base->tv_clock_diff);
		base->last_updated_clock_diff = tp->tv_sec;
	}

	return 0;
}